

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest12::testAtomicDraw
          (FunctionalTest12 *this,GLuint subroutine_index,GLuint *expected_results)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  uint *value;
  MessageBuilder *pMVar4;
  GLuint subroutine_index_local;
  undefined1 local_1b0 [384];
  long lVar3;
  
  subroutine_index_local = subroutine_index;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x1668))(0x8b30,1,&subroutine_index_local);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x17dc);
  (**(code **)(lVar3 + 0x538))(0,0,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x17e0);
  value = (uint *)(**(code **)(lVar3 + 0xcf8))(0x92c0,35000);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x17e4);
  iVar1 = bcmp(expected_results,value,0xc);
  if (iVar1 != 0) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Error. Invalid result. ");
    std::operator<<((ostream *)this_00,"Result: [ ");
    pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
    std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,value + 1);
    std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,value + 2);
    std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>," ] ");
    std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    "Expected: [ ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,expected_results);
    std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,expected_results + 1);
    std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,expected_results + 2);
    std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>," ]");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  (**(code **)(lVar3 + 0x1670))(0x92c0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x17f4);
  return iVar1 == 0;
}

Assistant:

bool FunctionalTest12::testAtomicDraw(GLuint subroutine_index, const GLuint expected_results[3]) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set subroutine uniforms */
	gl.uniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &subroutine_index);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Draw */
	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Capture results */
	GLuint* atomic_results = (GLuint*)gl.mapBuffer(GL_ATOMIC_COUNTER_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	/* Verify */
	bool result = (0 == memcmp(expected_results, atomic_results, 3 * sizeof(GLuint)));

	if (false == result)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Error. Invalid result. "
			<< "Result: [ " << atomic_results[0] << ", " << atomic_results[1] << ", " << atomic_results[2] << " ] "
			<< "Expected: [ " << expected_results[0] << ", " << expected_results[1] << ", " << expected_results[2]
			<< " ]" << tcu::TestLog::EndMessage;
	}

	/* Unmap buffer */
	gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Done */
	return result;
}